

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_andnot_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  _Bool _Var1;
  container_t *container2;
  uint8_t typecode2;
  uint8_t typecode1;
  container_t *container1;
  leaf_t *leaf2;
  leaf_t *leaf1;
  int compare_result;
  _Bool it2_present;
  art_iterator_t it2;
  art_iterator_t it1;
  undefined7 in_stack_fffffffffffffea8;
  uint8_t in_stack_fffffffffffffeaf;
  art_key_chunk_t *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  _Bool in_stack_fffffffffffffebf;
  art_t *in_stack_fffffffffffffec0;
  uint8_t type2;
  art_key_chunk_t *paVar2;
  uint8_t type1;
  long lVar3;
  int iVar4;
  uint in_stack_fffffffffffffedc;
  art_iterator_t *in_stack_fffffffffffffee0;
  art_t *in_stack_fffffffffffffee8;
  long local_90;
  
  art_init_iterator(in_stack_fffffffffffffec0,in_stack_fffffffffffffebf);
  art_init_iterator(in_stack_fffffffffffffec0,in_stack_fffffffffffffebf);
  while (local_90 != 0) {
    in_stack_fffffffffffffedc =
         CONCAT13(in_stack_fffffffffffffee8 != (art_t *)0x0,(int3)in_stack_fffffffffffffedc);
    iVar4 = 0;
    if ((in_stack_fffffffffffffee8 != (art_t *)0x0) &&
       (iVar4 = compare_high48(in_stack_fffffffffffffeb0,
                               (art_key_chunk_t *)
                               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)),
       iVar4 == 0)) {
      paVar2 = *(art_key_chunk_t **)(local_90 + 8);
      type2 = (uint8_t)((ulong)paVar2 >> 0x38);
      type1 = (uint8_t)((ulong)local_90 >> 0x38);
      lVar3 = local_90;
      if (*(char *)(local_90 + 6) == '\x04') {
        in_stack_fffffffffffffeb0 =
             (art_key_chunk_t *)
             container_andnot((container_t *)((ulong)in_stack_fffffffffffffedc << 0x20),type1,
                              in_stack_fffffffffffffee8,type2,
                              (uint8_t *)
                              CONCAT17(*(undefined1 *)(local_90 + 6),
                                       CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)
                                      ));
        if (in_stack_fffffffffffffeb0 != paVar2) {
          container_free(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf);
        }
      }
      else {
        in_stack_fffffffffffffeb0 =
             (art_key_chunk_t *)
             container_iandnot((container_t *)((ulong)in_stack_fffffffffffffedc << 0x20),type1,
                               in_stack_fffffffffffffee8,type2,
                               (uint8_t *)
                               CONCAT17(*(undefined1 *)(local_90 + 6),
                                        CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8
                                                )));
      }
      if (in_stack_fffffffffffffeb0 != paVar2) {
        *(art_key_chunk_t **)(lVar3 + 8) = in_stack_fffffffffffffeb0;
        *(undefined1 *)(lVar3 + 6) = in_stack_fffffffffffffebe;
      }
      _Var1 = container_nonzero_cardinality
                        ((container_t *)
                         CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),'\0');
      if (_Var1) {
        art_iterator_next((art_iterator_t *)0x111b26);
      }
      else {
        container_free(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf);
        art_iterator_erase(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        free_leaf((leaf_t *)0x111b17);
      }
      art_iterator_next((art_iterator_t *)0x111b30);
    }
    if (((in_stack_fffffffffffffedc & 0x1000000) == 0) || (iVar4 < 0)) {
      art_iterator_next((art_iterator_t *)0x111b4d);
    }
    else if (0 < iVar4) {
      art_iterator_next((art_iterator_t *)0x111b60);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_andnot_inplace(roaring64_bitmap_t *r1,
                                     const roaring64_bitmap_t *r2) {
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> it1++
        // 2. it1_present &&  it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                container_t *container1 = leaf1->container;
                uint8_t typecode1 = leaf1->typecode;
                uint8_t typecode2;
                container_t *container2;
                if (leaf1->typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_andnot(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                    if (container2 != container1) {
                        // We only free when doing container_andnot, not
                        // container_iandnot, as iandnot frees the original
                        // internally.
                        container_free(container1, typecode1);
                    }
                } else {
                    container2 = container_iandnot(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                }
                if (container2 != container1) {
                    leaf1->container = container2;
                    leaf1->typecode = typecode2;
                }

                if (!container_nonzero_cardinality(container2, typecode2)) {
                    container_free(container2, typecode2);
                    art_iterator_erase(&r1->art, &it1);
                    free_leaf(leaf1);
                } else {
                    // Only advance the iterator if we didn't delete the
                    // leaf, as erasing advances by itself.
                    art_iterator_next(&it1);
                }
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
}